

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_loader.c
# Opt level: O2

c_int lh_load_pardiso(char *libname)

{
  ulong uVar1;
  
  if (libname == (char *)0x0) {
    libname = "libmkl_rt.so";
  }
  Pardiso_handle = lh_load_lib(libname);
  uVar1 = 1;
  if (Pardiso_handle != (soHandle_t)0x0) {
    func_pardiso = (pardiso_t)lh_load_sym(Pardiso_handle,"pardiso");
    if (func_pardiso != (pardiso_t)0x0) {
      func_mkl_set_interface_layer =
           (mkl_set_ifl_t)lh_load_sym(Pardiso_handle,"MKL_Set_Interface_Layer");
      if (func_mkl_set_interface_layer != (mkl_set_ifl_t)0x0) {
        func_mkl_get_max_threads = (mkl_get_mt_t)lh_load_sym(Pardiso_handle,"MKL_Get_Max_Threads");
        uVar1 = (ulong)(func_mkl_get_max_threads == (mkl_get_mt_t)0x0);
      }
    }
  }
  return uVar1;
}

Assistant:

c_int lh_load_pardiso(const char* libname) {
    // DEBUG
    // if (Pardiso_handle) return 0;

    // Load Pardiso library
    if (libname) {
        Pardiso_handle = lh_load_lib(libname);
    } else { /* try a default library name */
        Pardiso_handle = lh_load_lib(PARDISOLIBNAME);
    }
    if (!Pardiso_handle) return 1;

    // Load Pardiso functions
    func_pardiso = (pardiso_t)lh_load_sym(Pardiso_handle, "pardiso");
    if (!func_pardiso) return 1;

    func_mkl_set_interface_layer = (mkl_set_ifl_t)lh_load_sym(Pardiso_handle,
                                                    "MKL_Set_Interface_Layer");
    if (!func_mkl_set_interface_layer) return 1;

    func_mkl_get_max_threads = (mkl_get_mt_t)lh_load_sym(Pardiso_handle,
                                                    "MKL_Get_Max_Threads");
    if (!func_mkl_get_max_threads) return 1;

    return 0;
}